

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

float3 ConvexDecomposition::normalize(float3 *v)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float3 fVar4;
  
  fVar3 = magnitude(v);
  if ((fVar3 == 0.0) && (!NAN(fVar3))) {
    puts("Cant normalize ZERO vector");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x1f6,"float3 ConvexDecomposition::normalize(const float3 &)");
  }
  fVar3 = 1.0 / fVar3;
  uVar1 = v->x;
  uVar2 = v->y;
  fVar4.x = fVar3 * (float)uVar1;
  fVar4.y = fVar3 * (float)uVar2;
  fVar4.z = fVar3 * v->z;
  return fVar4;
}

Assistant:

float3 normalize( const float3 &v )
{
	// this routine, normalize, is ok, provided magnitude works!!
		float d=magnitude(v);
		if (d==0)
		{
		printf("Cant normalize ZERO vector\n");
		assert(0);// yes this could go here
		d=0.1f;
	}
	d = 1/d;
	return float3(v.x*d,v.y*d,v.z*d);
}